

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swish_x86.cpp
# Opt level: O0

int __thiscall ncnn::Swish_x86::forward_inplace(Swish_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  long *in_RSI;
  float fVar6;
  int iVar7;
  float fVar9;
  float fVar10;
  undefined1 auVar8 [16];
  float fVar11;
  __m128 _p;
  __m128 _zero;
  __m128 _one;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  v4sf pow2n;
  v4sf y;
  v4sf mask;
  v4sf one;
  v4si emm0;
  v4sf fx;
  v4sf tmp;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  int local_778;
  undefined8 local_768;
  undefined8 local_760;
  undefined8 local_758;
  undefined4 local_750;
  long local_748;
  undefined4 local_740;
  undefined4 local_73c;
  undefined4 local_738;
  undefined4 local_734;
  undefined4 local_730;
  undefined8 local_728;
  undefined1 (*local_720) [16];
  int local_714;
  int local_710;
  int local_70c;
  int local_708;
  int local_704;
  int local_700;
  int local_6fc;
  long *local_6f0;
  undefined1 local_6dd;
  int local_6dc;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 *local_6b8;
  undefined4 local_6a8;
  undefined4 uStack_6a4;
  undefined4 uStack_6a0;
  undefined4 uStack_69c;
  undefined4 local_68c;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined1 (*local_670) [16];
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  float local_5e8;
  float fStack_5e4;
  float fStack_5e0;
  float fStack_5dc;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined1 (*local_500) [16];
  long local_4f8;
  undefined4 local_4ec;
  long local_4e8;
  undefined1 (*local_4e0) [16];
  undefined4 local_4d4;
  int local_4d0;
  int local_4cc;
  undefined8 *local_4c8;
  undefined4 local_4bc;
  long local_4b8;
  undefined8 *local_498;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_368;
  ulong uStack_360;
  undefined8 *local_350;
  float *local_348;
  float *local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  float local_318 [2];
  float afStack_310 [2];
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  float *local_2e8;
  float *local_2e0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float local_2b8 [2];
  float afStack_2b0 [2];
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  float *local_230;
  undefined8 *local_228;
  undefined8 *local_220;
  float local_218 [2];
  float afStack_210 [2];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float *local_1d0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  float local_1b8 [2];
  float afStack_1b0 [2];
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  float *local_170;
  undefined8 *local_168;
  undefined8 *local_160;
  float local_158 [2];
  float afStack_150 [2];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float *local_110;
  undefined8 *local_108;
  undefined8 *local_100;
  float local_f8 [2];
  float afStack_f0 [2];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float *local_b0;
  undefined8 *local_a8;
  undefined8 *local_a0;
  float local_98 [2];
  float afStack_90 [2];
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_6fc = *(int *)((long)in_RSI + 0x2c);
  local_700 = (int)in_RSI[6];
  local_704 = *(int *)((long)in_RSI + 0x34);
  local_708 = (int)in_RSI[7];
  local_70c = (int)in_RSI[3];
  local_710 = local_6fc * local_700 * local_704 * local_70c;
  local_6f0 = in_RSI;
  for (local_714 = 0; local_714 < local_708; local_714 = local_714 + 1) {
    local_6d0 = &local_768;
    local_4cc = *(int *)((long)local_6f0 + 0x2c);
    local_4d0 = (int)local_6f0[6];
    local_4d4 = *(undefined4 *)((long)local_6f0 + 0x34);
    local_4e0 = (undefined1 (*) [16])(*local_6f0 + local_6f0[8] * (long)local_714 * local_6f0[2]);
    local_4e8 = local_6f0[2];
    local_4ec = (undefined4)local_6f0[3];
    local_4f8 = local_6f0[4];
    local_4c8 = &local_768;
    local_4b8 = (long)local_4cc * (long)local_4d0 * local_4e8;
    local_6c8 = &local_768;
    local_6b8 = &local_768;
    local_4bc = 0x10;
    local_6dc = local_714;
    local_6dd = 1;
    local_768 = 0;
    local_758 = 0;
    local_750 = 0;
    local_740 = 0;
    local_73c = 0;
    local_738 = 0;
    local_734 = 0;
    local_730 = 0;
    local_728 = 0;
    local_760 = 0;
    local_68c = 0x3f800000;
    local_6a8 = 0x3f800000;
    uStack_6a4 = 0x3f800000;
    uStack_6a0 = 0x3f800000;
    uStack_69c = 0x3f800000;
    local_688 = 0;
    uStack_680 = 0;
    local_720 = local_4e0;
    for (local_778 = 0; local_498 = local_6b8, local_748 = local_4f8, local_778 + 3 < local_710;
        local_778 = local_778 + 4) {
      local_670 = local_720;
      local_658 = *(undefined8 *)*local_720;
      uStack_650 = *(undefined8 *)(*local_720 + 8);
      local_528 = 0;
      uStack_520 = 0;
      local_538._0_4_ = (float)local_658;
      local_538._4_4_ = (float)((ulong)local_658 >> 0x20);
      uStack_530._0_4_ = (float)uStack_650;
      uStack_530._4_4_ = (float)((ulong)uStack_650 >> 0x20);
      local_5b8 = CONCAT44(0.0 - local_538._4_4_,0.0 - (float)local_538);
      uStack_5b0._0_4_ = 0.0 - (float)uStack_530;
      uStack_5b0._4_4_ = 0.0 - uStack_530._4_4_;
      local_5a8 = 0;
      uStack_5a0 = 0;
      local_5f8 = 0x3f8000003f800000;
      uStack_5f0 = 0x3f8000003f800000;
      local_458 = local_5b8;
      uStack_450 = uStack_5b0;
      local_468 = 0x42b0c0a542b0c0a5;
      uStack_460 = 0x42b0c0a542b0c0a5;
      auVar4._8_8_ = uStack_5b0;
      auVar4._0_8_ = local_5b8;
      auVar3._8_8_ = 0x42b0c0a542b0c0a5;
      auVar3._0_8_ = 0x42b0c0a542b0c0a5;
      auVar8 = minps(auVar4,auVar3);
      local_5b8 = auVar8._0_8_;
      local_438 = local_5b8;
      uStack_5b0 = auVar8._8_8_;
      uStack_430 = uStack_5b0;
      local_448 = 0xc2b0c0a5c2b0c0a5;
      uStack_440 = 0xc2b0c0a5c2b0c0a5;
      auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar8 = maxps(auVar8,auVar5);
      local_5b8 = auVar8._0_8_;
      uVar1 = local_5b8;
      uStack_5b0 = auVar8._8_8_;
      uVar2 = uStack_5b0;
      local_3e8 = 0x3fb8aa3b3fb8aa3b;
      uStack_3e0 = 0x3fb8aa3b3fb8aa3b;
      local_3d8._0_4_ = auVar8._0_4_;
      local_3d8._4_4_ = auVar8._4_4_;
      uStack_3d0._0_4_ = auVar8._8_4_;
      uStack_3d0._4_4_ = auVar8._12_4_;
      local_568 = CONCAT44(local_3d8._4_4_ * 1.442695,(float)local_3d8 * 1.442695);
      uStack_560 = CONCAT44(uStack_3d0._4_4_ * 1.442695,(float)uStack_3d0 * 1.442695);
      local_578 = 0x3f0000003f000000;
      uStack_570 = 0x3f0000003f000000;
      fVar6 = (float)local_3d8 * 1.442695 + 0.5;
      fVar9 = local_3d8._4_4_ * 1.442695 + 0.5;
      fVar10 = (float)uStack_3d0 * 1.442695 + 0.5;
      fVar11 = uStack_3d0._4_4_ * 1.442695 + 0.5;
      local_3b8 = CONCAT44(fVar9,fVar6);
      uStack_3b0 = CONCAT44(fVar11,fVar10);
      local_3a8 = CONCAT44((int)fVar9,(int)fVar6);
      uStack_3a0 = CONCAT44((int)fVar11,(int)fVar10);
      local_5d8 = (float)(int)fVar6;
      fStack_5d4 = (float)(int)fVar9;
      fStack_5d0 = (float)(int)fVar10;
      fStack_5cc = (float)(int)fVar11;
      local_5c8 = CONCAT44(fStack_5d4,local_5d8);
      uStack_5c0 = CONCAT44(fStack_5cc,fStack_5d0);
      local_388 = local_5c8;
      uStack_380 = uStack_5c0;
      local_398 = CONCAT44(fVar9,fVar6);
      uStack_390 = CONCAT44(fVar11,fVar10);
      local_608 = CONCAT44(-(uint)(fVar9 < fStack_5d4),-(uint)(fVar6 < local_5d8));
      uStack_600 = CONCAT44(-(uint)(fVar11 < fStack_5cc),-(uint)(fVar10 < fStack_5d0));
      local_368 = local_608;
      uStack_360 = uStack_600;
      local_378 = 0x3f8000003f800000;
      uStack_370 = 0x3f8000003f800000;
      local_608 = local_608 & 0x3f8000003f800000;
      uStack_600 = uStack_600 & 0x3f8000003f800000;
      local_548 = local_5c8;
      uStack_540 = uStack_5c0;
      local_558._0_4_ = (float)local_608;
      local_558._4_4_ = (float)(local_608 >> 0x20);
      uStack_550._0_4_ = (float)uStack_600;
      uStack_550._4_4_ = (float)(uStack_600 >> 0x20);
      local_5d8 = local_5d8 - (float)local_558;
      fStack_5d4 = fStack_5d4 - local_558._4_4_;
      fStack_5d0 = fStack_5d0 - (float)uStack_550;
      fStack_5cc = fStack_5cc - uStack_550._4_4_;
      local_340 = &local_5d8;
      local_2e8 = ::_ps_cephes_exp_C1;
      local_350 = &local_5b8;
      local_2c8 = local_5b8;
      uStack_2c0 = uStack_5b0;
      local_2a8 = CONCAT44(fStack_5d4,local_5d8);
      uStack_2a0 = CONCAT44(fStack_5cc,fStack_5d0);
      local_2b8[0] = 0.6933594;
      local_2b8[1] = 0.6933594;
      afStack_2b0[0] = 0.6933594;
      afStack_2b0[1] = 0.6933594;
      local_2d8 = local_5d8 * 0.6933594;
      fStack_2d4 = fStack_5d4 * 0.6933594;
      fStack_2d0 = fStack_5d0 * 0.6933594;
      fStack_2cc = fStack_5cc * 0.6933594;
      local_5b8 = CONCAT44(local_3d8._4_4_ - fStack_2d4,(float)local_3d8 - local_2d8);
      uStack_5b0._0_4_ = (float)uStack_3d0 - fStack_2d0;
      uStack_5b0._4_4_ = uStack_3d0._4_4_ - fStack_2cc;
      local_348 = ::_ps_cephes_exp_C2;
      local_328 = local_5b8;
      uStack_320 = uStack_5b0;
      local_308 = CONCAT44(fStack_5d4,local_5d8);
      uStack_300 = CONCAT44(fStack_5cc,fStack_5d0);
      local_318[0] = -0.00021219444;
      local_318[1] = -0.00021219444;
      afStack_310[0] = -0.00021219444;
      afStack_310[1] = -0.00021219444;
      local_338 = local_5d8 * -0.00021219444;
      fStack_334 = fStack_5d4 * -0.00021219444;
      fStack_330 = fStack_5d0 * -0.00021219444;
      fStack_32c = fStack_5cc * -0.00021219444;
      fVar6 = ((float)local_3d8 - local_2d8) - local_338;
      fVar9 = (local_3d8._4_4_ - fStack_2d4) - fStack_334;
      fVar10 = ((float)uStack_3d0 - fStack_2d0) - fStack_330;
      fVar11 = (uStack_3d0._4_4_ - fStack_2cc) - fStack_32c;
      local_5b8 = CONCAT44(fVar9,fVar6);
      uStack_5b0._0_4_ = fVar10;
      uStack_5b0._4_4_ = fVar11;
      local_408 = local_5b8;
      uStack_400 = uStack_5b0;
      local_5c8 = CONCAT44(fVar9 * fVar9,fVar6 * fVar6);
      uStack_5c0 = CONCAT44(fVar11 * fVar11,fVar10 * fVar10);
      local_280 = &local_618;
      local_b0 = ::_ps_cephes_exp_p1;
      local_68 = 0x3950696739506967;
      uStack_60 = 0x3950696739506967;
      local_78 = local_5b8;
      uStack_70 = uStack_5b0;
      local_88 = fVar6 * 0.00019875691;
      fStack_84 = fVar9 * 0.00019875691;
      fStack_80 = fVar10 * 0.00019875691;
      fStack_7c = fVar11 * 0.00019875691;
      local_98[0] = 0.0013981999;
      local_98[1] = 0.0013981999;
      afStack_90[0] = 0.0013981999;
      afStack_90[1] = 0.0013981999;
      local_618 = CONCAT44(fStack_84 + 0.0013981999,local_88 + 0.0013981999);
      uStack_610 = CONCAT44(fStack_7c + 0.0013981999,fStack_80 + 0.0013981999);
      local_110 = ::_ps_cephes_exp_p2;
      local_c8 = local_618;
      uStack_c0 = uStack_610;
      local_d8 = local_5b8;
      uStack_d0 = uStack_5b0;
      local_e8 = (local_88 + 0.0013981999) * fVar6;
      fStack_e4 = (fStack_84 + 0.0013981999) * fVar9;
      fStack_e0 = (fStack_80 + 0.0013981999) * fVar10;
      fStack_dc = (fStack_7c + 0.0013981999) * fVar11;
      local_f8[0] = 0.008333452;
      local_f8[1] = 0.008333452;
      afStack_f0[0] = 0.008333452;
      afStack_f0[1] = 0.008333452;
      local_618 = CONCAT44(fStack_e4 + 0.008333452,local_e8 + 0.008333452);
      uStack_610 = CONCAT44(fStack_dc + 0.008333452,fStack_e0 + 0.008333452);
      local_170 = ::_ps_cephes_exp_p3;
      local_128 = local_618;
      uStack_120 = uStack_610;
      local_138 = local_5b8;
      uStack_130 = uStack_5b0;
      local_148 = (local_e8 + 0.008333452) * fVar6;
      fStack_144 = (fStack_e4 + 0.008333452) * fVar9;
      fStack_140 = (fStack_e0 + 0.008333452) * fVar10;
      fStack_13c = (fStack_dc + 0.008333452) * fVar11;
      local_158[0] = 0.041665796;
      local_158[1] = 0.041665796;
      afStack_150[0] = 0.041665796;
      afStack_150[1] = 0.041665796;
      local_618 = CONCAT44(fStack_144 + 0.041665796,local_148 + 0.041665796);
      uStack_610 = CONCAT44(fStack_13c + 0.041665796,fStack_140 + 0.041665796);
      local_1d0 = ::_ps_cephes_exp_p4;
      local_188 = local_618;
      uStack_180 = uStack_610;
      local_198 = local_5b8;
      uStack_190 = uStack_5b0;
      local_1a8 = (local_148 + 0.041665796) * fVar6;
      fStack_1a4 = (fStack_144 + 0.041665796) * fVar9;
      fStack_1a0 = (fStack_140 + 0.041665796) * fVar10;
      fStack_19c = (fStack_13c + 0.041665796) * fVar11;
      local_1b8[0] = 0.16666666;
      local_1b8[1] = 0.16666666;
      afStack_1b0[0] = 0.16666666;
      afStack_1b0[1] = 0.16666666;
      local_618 = CONCAT44(fStack_1a4 + 0.16666666,local_1a8 + 0.16666666);
      uStack_610 = CONCAT44(fStack_19c + 0.16666666,fStack_1a0 + 0.16666666);
      local_230 = ::_ps_cephes_exp_p5;
      local_1e8 = local_618;
      uStack_1e0 = uStack_610;
      local_1f8 = local_5b8;
      uStack_1f0 = uStack_5b0;
      local_208 = (local_1a8 + 0.16666666) * fVar6;
      fStack_204 = (fStack_1a4 + 0.16666666) * fVar9;
      fStack_200 = (fStack_1a0 + 0.16666666) * fVar10;
      fStack_1fc = (fStack_19c + 0.16666666) * fVar11;
      local_218[0] = 0.5;
      local_218[1] = 0.5;
      afStack_210[0] = 0.5;
      afStack_210[1] = 0.5;
      local_618 = CONCAT44(fStack_204 + 0.5,local_208 + 0.5);
      uStack_610 = CONCAT44(fStack_1fc + 0.5,fStack_200 + 0.5);
      local_288 = &local_5c8;
      local_248 = local_618;
      uStack_240 = uStack_610;
      local_258 = local_5c8;
      uStack_250 = uStack_5c0;
      local_268 = (local_208 + 0.5) * fVar6 * fVar6;
      fStack_264 = (fStack_204 + 0.5) * fVar9 * fVar9;
      fStack_260 = (fStack_200 + 0.5) * fVar10 * fVar10;
      fStack_25c = (fStack_1fc + 0.5) * fVar11 * fVar11;
      local_278 = local_5b8;
      uStack_270 = uStack_5b0;
      local_618 = CONCAT44(fStack_264 + fVar9,local_268 + fVar6);
      uStack_610 = CONCAT44(fStack_25c + fVar11,fStack_260 + fVar10);
      local_588 = local_618;
      uStack_580 = uStack_610;
      local_598 = 0x3f8000003f800000;
      uStack_590 = 0x3f8000003f800000;
      local_668 = local_268 + fVar6 + 1.0;
      fStack_664 = fStack_264 + fVar9 + 1.0;
      fStack_660 = fStack_260 + fVar10 + 1.0;
      fStack_65c = fStack_25c + fVar11 + 1.0;
      local_618 = CONCAT44(fStack_664,local_668);
      uStack_610 = CONCAT44(fStack_65c,fStack_660);
      local_3c8 = CONCAT44(fStack_5d4,local_5d8);
      uStack_3c0 = CONCAT44(fStack_5cc,fStack_5d0);
      local_48 = CONCAT44((int)fStack_5d4,(int)local_5d8);
      uStack_40 = CONCAT44((int)fStack_5cc,(int)fStack_5d0);
      local_58 = 0x7f0000007f;
      uStack_50 = 0x7f0000007f;
      iVar7 = (int)local_5d8 + 0x7f;
      fStack_5e4 = (float)((int)fStack_5d4 + 0x7f);
      fStack_5e0 = (float)((int)fStack_5d0 + 0x7f);
      fStack_5dc = (float)((int)fStack_5cc + 0x7f);
      local_28 = CONCAT44(fStack_5e4,iVar7);
      uStack_20 = CONCAT44(fStack_5dc,fStack_5e0);
      local_2c = 0x17;
      local_5e8 = (float)(iVar7 * 0x800000);
      local_628 = CONCAT44(fStack_5e4,local_5e8);
      uStack_620 = CONCAT44(fStack_5dc,fStack_5e0);
      local_418 = local_618;
      uStack_410 = uStack_610;
      local_668 = local_668 * local_5e8;
      fStack_664 = fStack_664 * fStack_5e4;
      fStack_660 = fStack_660 * fStack_5e0;
      fStack_65c = fStack_65c * fStack_5dc;
      local_618 = CONCAT44(fStack_664,local_668);
      uStack_610 = CONCAT44(fStack_65c,fStack_660);
      local_648 = local_618;
      uStack_640 = uStack_610;
      local_668 = local_668 + 1.0;
      fStack_664 = fStack_664 + 1.0;
      fStack_660 = fStack_660 + 1.0;
      fStack_65c = fStack_65c + 1.0;
      auVar8._4_4_ = fStack_664;
      auVar8._0_4_ = local_668;
      auVar8._8_4_ = fStack_660;
      auVar8._12_4_ = fStack_65c;
      auVar8 = divps(*local_720,auVar8);
      local_500 = local_720;
      local_7a8 = auVar8._0_8_;
      local_518 = local_7a8;
      uStack_7a0 = auVar8._8_8_;
      uStack_510 = uStack_7a0;
      *(undefined8 *)*local_720 = local_7a8;
      *(undefined8 *)(*local_720 + 8) = uStack_7a0;
      local_720 = local_720 + 1;
      local_638 = 0x3f8000003f800000;
      uStack_630 = 0x3f8000003f800000;
      local_558 = local_608;
      uStack_550 = uStack_600;
      local_538 = local_658;
      uStack_530 = uStack_650;
      local_428 = local_628;
      uStack_420 = uStack_620;
      local_3f8 = local_408;
      uStack_3f0 = uStack_400;
      local_3d8 = uVar1;
      uStack_3d0 = uVar2;
      local_2f0 = local_350;
      local_2e0 = local_340;
      local_290 = local_350;
      local_228 = local_350;
      local_220 = local_280;
      local_1c8 = local_350;
      local_1c0 = local_280;
      local_168 = local_350;
      local_160 = local_280;
      local_108 = local_350;
      local_100 = local_280;
      local_a8 = local_350;
      local_a0 = local_280;
      local_18 = local_628;
      uStack_10 = uStack_620;
    }
    for (; local_778 < local_710; local_778 = local_778 + 1) {
      fVar6 = *(float *)*local_720;
      fVar9 = expf(-*(float *)*local_720);
      *(float *)*local_720 = fVar6 / (fVar9 + 1.0);
      local_720 = (undefined1 (*) [16])(*local_720 + 4);
    }
  }
  return 0;
}

Assistant:

int Swish_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _p = _mm512_div_ps(_p, _mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _p))));
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_div_ps(_p, _mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _p))));
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_div_ps(_p, _mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _p))));
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr / (1.f + expf(-*ptr));
            ptr++;
        }
    }

    return 0;
}